

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O2

bool compare_defaults(t_const_value *newStructDefault,t_const_value *oldStructDefault)

{
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  __first2;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  __first1;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  __last1;
  bool bVar1;
  __type _Var2;
  t_const_value_type tVar3;
  t_const_value_type tVar4;
  int64_t iVar5;
  int64_t iVar6;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  newMap;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  oldMap;
  _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  local_80;
  _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  local_50;
  
  if (newStructDefault == (t_const_value *)0x0 && oldStructDefault == (t_const_value *)0x0) {
    return true;
  }
  if ((newStructDefault == (t_const_value *)0x0) != (oldStructDefault == (t_const_value *)0x0))
  goto switchD_0013d378_default;
  tVar3 = t_const_value::get_type(newStructDefault);
  tVar4 = t_const_value::get_type(oldStructDefault);
  if (tVar3 != tVar4) goto switchD_0013d378_default;
  tVar3 = t_const_value::get_type(newStructDefault);
  switch(tVar3) {
  case CV_INTEGER:
    iVar5 = t_const_value::get_integer(newStructDefault);
    iVar6 = t_const_value::get_integer(oldStructDefault);
    _Var2 = iVar5 == iVar6;
    break;
  case CV_DOUBLE:
    _Var2 = (__type)(-(oldStructDefault->doubleVal_ == newStructDefault->doubleVal_) & 1);
    break;
  case CV_STRING:
    std::__cxx11::string::string((string *)&local_80,(string *)&newStructDefault->stringVal_);
    std::__cxx11::string::string((string *)&local_50,(string *)&oldStructDefault->stringVal_);
    goto LAB_0013d487;
  case CV_MAP:
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::_Rb_tree(&local_80,
               (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)newStructDefault);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::_Rb_tree(&local_50,
               (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)oldStructDefault);
    if (local_50._M_impl.super__Rb_tree_header._M_node_count ==
        local_80._M_impl.super__Rb_tree_header._M_node_count) {
      _Var2 = std::
              equal<std::_Rb_tree_const_iterator<std::pair<t_const_value*const,t_const_value*>>,std::_Rb_tree_const_iterator<std::pair<t_const_value*const,t_const_value*>>,bool(*)(std::pair<t_const_value*,t_const_value*>,std::pair<t_const_value*,t_const_value*>)>
                        ((_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                         )local_80._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                         )&local_80._M_impl.super__Rb_tree_header,
                         (_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                         )local_50._M_impl.super__Rb_tree_header._M_header._M_left,compare_pair);
    }
    else {
      _Var2 = false;
    }
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~_Rb_tree(&local_50);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~_Rb_tree(&local_80);
    break;
  case CV_LIST:
    __first2._M_current =
         (oldStructDefault->listVal_).
         super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    __first1._M_current =
         (newStructDefault->listVal_).
         super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last1._M_current =
         (newStructDefault->listVal_).
         super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((long)(oldStructDefault->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__first2._M_current ==
        (long)__last1._M_current - (long)__first1._M_current) {
      bVar1 = std::
              equal<__gnu_cxx::__normal_iterator<t_const_value*const*,std::vector<t_const_value*,std::allocator<t_const_value*>>>,__gnu_cxx::__normal_iterator<t_const_value*const*,std::vector<t_const_value*,std::allocator<t_const_value*>>>,bool(*)(t_const_value*,t_const_value*)>
                        (__first1,__last1,__first2,compare_defaults);
      return bVar1;
    }
  default:
switchD_0013d378_default:
    _Var2 = false;
    break;
  case CV_IDENTIFIER:
    std::__cxx11::string::string((string *)&local_80,(string *)&newStructDefault->identifierVal_);
    std::__cxx11::string::string((string *)&local_50,(string *)&oldStructDefault->identifierVal_);
LAB_0013d487:
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_80,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return _Var2;
}

Assistant:

bool compare_defaults(t_const_value* newStructDefault, t_const_value* oldStructDefault)
{
   if(newStructDefault == nullptr && oldStructDefault == nullptr) return true;
   else if(newStructDefault == nullptr && oldStructDefault != nullptr) return false;
   else if (newStructDefault != nullptr && oldStructDefault == nullptr) return false;

   if(newStructDefault->get_type() != oldStructDefault->get_type())
   {
      return false;
   }

   switch(newStructDefault->get_type())
   {
      case t_const_value::CV_INTEGER:
         return (newStructDefault->get_integer() == oldStructDefault->get_integer());
      case t_const_value::CV_DOUBLE:
         return (newStructDefault->get_double() == oldStructDefault->get_double());
      case t_const_value::CV_STRING:
         return (newStructDefault->get_string() == oldStructDefault->get_string());
      case t_const_value::CV_LIST:
         {
            const std::vector<t_const_value*>& oldDefaultList = oldStructDefault->get_list();
            const std::vector<t_const_value*>& newDefaultList = newStructDefault->get_list();
            bool defaultValuesCompare = (oldDefaultList.size() == newDefaultList.size());

            return defaultValuesCompare && std::equal(newDefaultList.begin(), newDefaultList.end(), oldDefaultList.begin(), compare_defaults);
         }
      case t_const_value::CV_MAP:
         {
            const std::map<t_const_value*, t_const_value*, t_const_value::value_compare> newMap = newStructDefault->get_map();
            const std::map<t_const_value*, t_const_value*, t_const_value::value_compare> oldMap = oldStructDefault->get_map();

            bool defaultValuesCompare = (oldMap.size() == newMap.size());

            return defaultValuesCompare && std::equal(newMap.begin(), newMap.end(), oldMap.begin(), compare_pair);
         }
      case t_const_value::CV_IDENTIFIER:
         return (newStructDefault->get_identifier() == oldStructDefault->get_identifier());
      default:
         return false;
   }

}